

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImagePositionCalculator.cpp
# Opt level: O0

array<float,_16UL> * __thiscall
ImagePositionCalculator::GetCenteredRectangleVertexCoordinates
          (array<float,_16UL> *__return_storage_ptr__,ImagePositionCalculator *this,int deviceWidth,
          int deviceHeight,int imageWidth,int imageHeight)

{
  int imageHeight_local;
  int imageWidth_local;
  int deviceHeight_local;
  int deviceWidth_local;
  ImagePositionCalculator *this_local;
  
  __return_storage_ptr__->_M_elems[0] = ((float)deviceWidth * 1.0) / 2.0 - (float)(imageWidth / 2);
  __return_storage_ptr__->_M_elems[1] = ((float)deviceHeight * 1.0) / 2.0 - (float)(imageHeight / 2)
  ;
  __return_storage_ptr__->_M_elems[2] = 0.0;
  __return_storage_ptr__->_M_elems[3] = 0.0;
  __return_storage_ptr__->_M_elems[4] = ((float)deviceWidth * 1.0) / 2.0 + (float)(imageWidth / 2);
  __return_storage_ptr__->_M_elems[5] = ((float)deviceHeight * 1.0) / 2.0 - (float)(imageHeight / 2)
  ;
  __return_storage_ptr__->_M_elems[6] = 1.0;
  __return_storage_ptr__->_M_elems[7] = 0.0;
  __return_storage_ptr__->_M_elems[8] = ((float)deviceWidth * 1.0) / 2.0 + (float)(imageWidth / 2);
  __return_storage_ptr__->_M_elems[9] = ((float)deviceHeight * 1.0) / 2.0 + (float)(imageHeight / 2)
  ;
  __return_storage_ptr__->_M_elems[10] = 1.0;
  __return_storage_ptr__->_M_elems[0xb] = 1.0;
  __return_storage_ptr__->_M_elems[0xc] = ((float)deviceWidth * 1.0) / 2.0 - (float)(imageWidth / 2)
  ;
  __return_storage_ptr__->_M_elems[0xd] =
       ((float)deviceHeight * 1.0) / 2.0 + (float)(imageHeight / 2);
  __return_storage_ptr__->_M_elems[0xe] = 0.0;
  __return_storage_ptr__->_M_elems[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

std::array<float, 16> ImagePositionCalculator::GetCenteredRectangleVertexCoordinates(int deviceWidth, int deviceHeight, int imageWidth, int imageHeight)
{
    //assumes we are using an elements array to build the 2 triangles that make up the square
    //format is: x, y, s, t for each point [s, t are the normalized texture coordinates]
    return std::array<float, 16>{
        1.0f * deviceWidth / 2 - imageWidth / 2,
        1.0f * deviceHeight / 2 - imageHeight / 2, 0.0f, 0.0f,
        1.0f * deviceWidth / 2 + imageWidth / 2,
        1.0f * deviceHeight / 2 - imageHeight / 2, 1.0f, 0.0f,
        1.0f * deviceWidth / 2 + imageWidth / 2,
        1.0f * deviceHeight / 2 + imageHeight / 2, 1.0f, 1.0f,
        1.0f * deviceWidth / 2 - imageWidth / 2,
        1.0f * deviceHeight / 2 + imageHeight / 2, 0.0f, 1.0f};
}